

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void Intra4Preds_C(uint8_t *dst,uint8_t *top)

{
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint8_t *unaff_retaddr;
  uint8_t *in_stack_ffffffffffffffe8;
  
  DC4(in_RSI,in_stack_ffffffffffffffe8);
  TM4(in_RDI + 0x604,in_RSI);
  VE4(in_RDI + 0x608,in_RSI);
  HE4(unaff_retaddr,in_RDI);
  RD4(in_RDI + 0x610,in_RSI);
  VR4(in_RDI + 0x614,in_RSI);
  LD4(in_RDI + 0x618,in_RSI);
  VL4(in_RDI + 0x61c,in_RSI);
  HD4(in_RDI + 0x680,in_RSI);
  HU4(in_RDI + 0x684,in_RSI);
  return;
}

Assistant:

static void Intra4Preds_C(uint8_t* dst, const uint8_t* top) {
  DC4(I4DC4 + dst, top);
  TM4(I4TM4 + dst, top);
  VE4(I4VE4 + dst, top);
  HE4(I4HE4 + dst, top);
  RD4(I4RD4 + dst, top);
  VR4(I4VR4 + dst, top);
  LD4(I4LD4 + dst, top);
  VL4(I4VL4 + dst, top);
  HD4(I4HD4 + dst, top);
  HU4(I4HU4 + dst, top);
}